

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O2

ssize_t __thiscall
GGSock::Communicator::send(Communicator *this,int __fd,void *__buf,size_t __n,int __flags)

{
  _Head_base<0UL,_GGSock::Communicator::Data_*,_false> this_00;
  bool bVar1;
  undefined7 extraout_var;
  ulong uVar2;
  TMessageType type_local;
  TBufferSize size;
  string msg;
  
  type_local = (TMessageType)__fd;
  this_00._M_head_impl =
       (this->data_)._M_t.
       super___uniq_ptr_impl<GGSock::Communicator::Data,_std::default_delete<GGSock::Communicator::Data>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::Communicator::Data_*,_std::default_delete<GGSock::Communicator::Data>_>
       .super__Head_base<0UL,_GGSock::Communicator::Data_*,_false>._M_head_impl;
  std::mutex::lock((mutex *)&((pthread_mutex_t *)&(this_00._M_head_impl)->mutexSend)->__data);
  if ((this_00._M_head_impl)->isConnected == false) {
    uVar2 = 0;
  }
  else {
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    msg._M_string_length = 0;
    msg.field_2._M_local_buf[0] = '\0';
    size = 6;
    std::__cxx11::string::reserve((ulong)&msg);
    std::__cxx11::string::append<char_const*,void>((string *)&msg,(char *)&size,(char *)&msg);
    std::__cxx11::string::append<char_const*,void>((string *)&msg,(char *)&type_local,(char *)&size)
    ;
    bVar1 = Data::addMessageToSend(this_00._M_head_impl,&msg);
    uVar2 = CONCAT71(extraout_var,bVar1) & 0xffffffff;
    std::__cxx11::string::~string((string *)&msg);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&(this_00._M_head_impl)->mutexSend);
  return uVar2;
}

Assistant:

bool Communicator::send(TMessageType type) {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutexSend);

        if (data.isConnected == false) return false;

        {
            std::string msg;
            TBufferSize size = ::MessageHeader::getSizeInBytes();

            msg.reserve(size);

            msg.append(reinterpret_cast<const char*>(&size), reinterpret_cast<const char*>(&size)+sizeof(size));
            msg.append(reinterpret_cast<const char*>(&type), reinterpret_cast<const char*>(&type)+sizeof(type));

            if (data.addMessageToSend(std::move(msg)) == false) {
                // error, send buffer is full
                return false;
            }
        }

        return true;
    }